

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsetstr(bstring b0,int pos,bstring b1,uchar fill)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bstring local_40;
  
  iVar5 = -1;
  if (((b0 != (bstring)0x0 && -1 < pos) && (-1 < b0->slen)) && (b0->data != (uchar *)0x0)) {
    uVar6 = (ulong)(uint)pos;
    uVar4 = b0->mlen;
    if (0 < (int)uVar4 && b0->slen <= (int)uVar4) {
      if (b1 == (bstring)0x0) {
        local_40 = (bstring)0x0;
        uVar3 = uVar6;
      }
      else {
        if (b1->slen < 0) {
          return -1;
        }
        if (b1->data == (uchar *)0x0) {
          return -1;
        }
        local_40 = b1;
        if (((ulong)((long)b1->data - (long)b0->data) < (ulong)uVar4) &&
           (local_40 = bstrcpy(b1), local_40 == (bstring)0x0)) {
          return -1;
        }
        uVar3 = (ulong)(uint)(local_40->slen + pos);
      }
      iVar1 = balloc(b0,(int)uVar3 + 1);
      if (iVar1 == 0) {
        uVar4 = b0->slen;
        if ((int)uVar4 < pos) {
          uVar2 = (ulong)(int)uVar4;
          do {
            b0->data[uVar2] = fill;
            uVar2 = uVar2 + 1;
            uVar4 = pos;
          } while (uVar6 != uVar2);
        }
        if (local_40 != (bstring)0x0) {
          if (0 < (long)local_40->slen) {
            memmove(b0->data + uVar6,local_40->data,(long)local_40->slen);
          }
          if (local_40 != b1) {
            bdestroy(local_40);
          }
        }
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < (int)uVar3) {
          uVar6 = uVar3;
        }
        b0->slen = (int)uVar6;
        b0->data[uVar6] = '\0';
        iVar5 = 0;
      }
      else if (local_40 != b1) {
        bdestroy(local_40);
      }
    }
  }
  return iVar5;
}

Assistant:

int bsetstr (bstring b0, int pos, const bstring b1, unsigned char fill) {
int i, d, newlen;
ptrdiff_t pd;
bstring aux = b1;

	if (pos < 0 || b0 == NULL || b0->slen < 0 || NULL == b0->data || 
	    b0->mlen < b0->slen || b0->mlen <= 0) return BSTR_ERR;
	if (b1 != NULL && (b1->slen < 0 || b1->data == NULL)) return BSTR_ERR;

	d = pos;

	/* Aliasing case */
	if (NULL != aux) {
		if ((pd = (ptrdiff_t) (b1->data - b0->data)) >= 0 && pd < (ptrdiff_t) b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		d += aux->slen;
	}

	/* Increase memory size if necessary */
	if (balloc (b0, d + 1) != BSTR_OK) {
		if (aux != b1) bdestroy (aux);
		return BSTR_ERR;
	}

	newlen = b0->slen;

	/* Fill in "fill" character as necessary */
	if (pos > newlen) {
		for (i = b0->slen; i < pos; i ++) b0->data[i] = fill;
		newlen = pos;
	}

	/* Copy b1 to position pos in b0. */
	if (aux != NULL) {
		bBlockCopy ((char *) (b0->data + pos), (char *) aux->data, aux->slen);
		if (aux != b1) bdestroy (aux);
	}

	/* Indicate the potentially increased size of b0 */
	if (d > newlen) newlen = d;

	b0->slen = newlen;
	b0->data[newlen] = (unsigned char) '\0';

	return BSTR_OK;
}